

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::SwapFieldHelper::SwapRepeatedStringField<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  undefined1 uVar1;
  CppStringType CVar2;
  RepeatedField<absl::lts_20250127::Cord> *this;
  RepeatedField<absl::lts_20250127::Cord> *other;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  SwapFieldHelper local_30 [16];
  
  CVar2 = FieldDescriptor::cpp_string_type(field);
  if ((CVar2 == kView) || (CVar2 == kString)) {
    Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(r,field);
    pvVar3 = Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(r,field);
    pvVar4 = Reflection::MutableRawImpl(r,rhs,field);
    if (pvVar3 == pvVar4) {
      SwapRepeatedStringField<true>(local_30);
    }
    lVar5 = 0;
    do {
      uVar1 = *(undefined1 *)((long)pvVar3 + lVar5);
      *(undefined1 *)((long)pvVar3 + lVar5) = *(undefined1 *)((long)pvVar4 + lVar5);
      *(undefined1 *)((long)pvVar4 + lVar5) = uVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
  }
  else if (CVar2 == kCord) {
    Reflection::VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(r,field);
    this = (RepeatedField<absl::lts_20250127::Cord> *)Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(r,field);
    other = (RepeatedField<absl::lts_20250127::Cord> *)Reflection::MutableRawImpl(r,rhs,field);
    RepeatedField<absl::lts_20250127::Cord>::InternalSwap(this,other);
    return;
  }
  return;
}

Assistant:

void SwapFieldHelper::SwapRepeatedStringField(const Reflection* r, Message* lhs,
                                              Message* rhs,
                                              const FieldDescriptor* field) {
  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      auto* lhs_cord = r->MutableRaw<RepeatedField<absl::Cord>>(lhs, field);
      auto* rhs_cord = r->MutableRaw<RepeatedField<absl::Cord>>(rhs, field);
      if (unsafe_shallow_swap) {
        lhs_cord->InternalSwap(rhs_cord);
      } else {
        lhs_cord->Swap(rhs_cord);
      }
      break;
    }
    case FieldDescriptor::CppStringType::kView:
    case FieldDescriptor::CppStringType::kString: {
      auto* lhs_string = r->MutableRaw<RepeatedPtrFieldBase>(lhs, field);
      auto* rhs_string = r->MutableRaw<RepeatedPtrFieldBase>(rhs, field);
      if (unsafe_shallow_swap) {
        lhs_string->InternalSwap(rhs_string);
      } else {
        lhs_string->Swap<GenericTypeHandler<std::string>>(rhs_string);
      }
      break;
    }
  }
}